

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O2

void __thiscall
TPZSparseBlockDiagonal<float>::UpdateFrom
          (TPZSparseBlockDiagonal<float> *this,TPZAutoPointer<TPZMatrix<float>_> *mat)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  TPZMatrix<float> *pTVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long newsize;
  TPZFMatrix<float> block;
  TPZManVector<long,_1000> indices;
  TPZFMatrix<float> local_2020;
  TPZManVector<long,_1000> local_1f90;
  
  if ((mat->fRef != (TPZReference *)0x0) && (mat->fRef->fPointer != (TPZMatrix<float> *)0x0)) {
    (this->super_TPZBlockDiagonal<float>).super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed =
         '\0';
    lVar7 = (this->super_TPZBlockDiagonal<float>).fBlockSize.fNElements;
    lVar6 = 0;
    TPZManVector<long,_1000>::TPZManVector(&local_1f90,0);
    if (lVar7 < 1) {
      lVar7 = lVar6;
    }
    for (; lVar6 != lVar7; lVar6 = lVar6 + 1) {
      newsize = (long)(this->super_TPZBlockDiagonal<float>).fBlockSize.fStore[lVar6];
      TPZManVector<long,_1000>::Resize(&local_1f90,newsize);
      plVar1 = (this->fBlock).fStore;
      lVar2 = (this->super_TPZBlockDiagonal<float>).fBlockPos.fStore[lVar6];
      plVar3 = (this->fBlockIndex).fStore;
      lVar8 = 0;
      if (0 < newsize) {
        lVar8 = newsize;
      }
      for (lVar9 = 0; lVar8 != lVar9; lVar9 = lVar9 + 1) {
        local_1f90.super_TPZVec<long>.fStore[lVar9] = plVar1[plVar3[lVar6] + lVar9];
      }
      TPZFMatrix<float>::TPZFMatrix
                (&local_2020,newsize,newsize,
                 (this->super_TPZBlockDiagonal<float>).fStorage.fStore + lVar2,newsize * newsize);
      pTVar4 = mat->fRef->fPointer;
      (*(pTVar4->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x49])
                (pTVar4,&local_1f90,&local_2020);
      TPZFMatrix<float>::~TPZFMatrix(&local_2020);
    }
    TPZManVector<long,_1000>::~TPZManVector(&local_1f90);
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,
                           "virtual void TPZSparseBlockDiagonal<float>::UpdateFrom(TPZAutoPointer<TPZMatrix<TVar>>) [TVar = float]"
                          );
  std::operator<<(poVar5," called with zero argument\n");
  return;
}

Assistant:

void TPZSparseBlockDiagonal<TVar>::UpdateFrom(TPZAutoPointer<TPZMatrix<TVar> > mat)
{
#ifdef PZ_LOG
	LOGPZ_DEBUG(logger, "TPZSparseBlockDiagonal::UpdateFrom");
#endif
	if(!mat) 
	{
		cout << __PRETTY_FUNCTION__ << " called with zero argument\n";
		return;
	}
	this->fDecomposed = ENoDecompose;
	int64_t nblock = this->fBlockSize.NElements();
	int64_t b,bsize,pos;
	TPZManVector<int64_t,1000> indices;
	for(b=0; b<nblock; b++) {
		bsize = this->fBlockSize[b];
		indices.Resize(bsize);
		int64_t r;
		pos = this->fBlockPos[b];
		for(r=0; r<bsize; r++) indices[r] = fBlock[fBlockIndex[b]+r]; 
		TPZFMatrix<TVar> block(bsize,bsize,&this->fStorage[pos],bsize*bsize);
		mat->GetSub(indices,block);
	}
	
}